

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.h
# Opt level: O3

void __thiscall
ccs::SearchState::cacheProperty
          (SearchState *this,string *propertyName,Specificity spec,Property *property)

{
  _Base_ptr p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  char cVar3;
  uint uVar4;
  iterator iVar5;
  const_iterator cVar6;
  element_type *peVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>,_bool>
  pVar8;
  PropertySetting newSetting;
  Property *local_d8;
  PropertySetting local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
  local_90;
  
  this_00 = &this->properties;
  local_d8 = property;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
          ::find(&this_00->_M_t,propertyName);
  PropertySetting::PropertySetting(&local_d0,spec,property);
  p_Var2 = &(this->properties)._M_t._M_impl.super__Rb_tree_header;
  peVar7 = (this->parent).super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar7 != (element_type *)0x0 && (_Rb_tree_header *)iVar5._M_node == p_Var2) {
    do {
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
              ::find(&(peVar7->properties)._M_t,propertyName);
      if ((_Rb_tree_header *)cVar6._M_node !=
          &(peVar7->properties)._M_t._M_impl.super__Rb_tree_header) {
        if (*(char *)&cVar6._M_node[2]._M_parent == '\x01') {
          if (local_d0.override == false) goto LAB_0014bac0;
LAB_0014b9cc:
          if ((local_d0.spec.values < *(uint *)&cVar6._M_node[2].field_0x4) ||
             ((local_d0.spec.values == *(uint *)&cVar6._M_node[2].field_0x4 &&
              (local_d0.spec.names < (((PropertySetting *)(cVar6._M_node + 2))->spec).names))))
          goto LAB_0014bac0;
        }
        else if (local_d0.override == false) goto LAB_0014b9cc;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_true>
                  (&local_90,propertyName,(PropertySetting *)(cVar6._M_node + 2));
        pVar8 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,ccs::PropertySetting>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
                            *)this_00,&local_90);
        iVar5._M_node = (_Base_ptr)pVar8.first._M_node;
        std::
        _Rb_tree<const_ccs::Property_*,_const_ccs::Property_*,_std::_Identity<const_ccs::Property_*>,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
        ::~_Rb_tree(&local_90.second.values._M_t);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
          operator_delete(local_90.first._M_dataplus._M_p,
                          local_90.first.field_2._M_allocated_capacity + 1);
        }
        break;
      }
      peVar7 = (peVar7->parent).
               super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    } while (peVar7 != (element_type *)0x0);
  }
  if ((_Rb_tree_header *)iVar5._M_node == p_Var2) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
    ::pair<ccs::PropertySetting_&,_true>(&local_90,propertyName,&local_d0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,ccs::PropertySetting>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ccs::PropertySetting>,std::_Select1st<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
                *)this_00,&local_90);
    std::
    _Rb_tree<const_ccs::Property_*,_const_ccs::Property_*,_std::_Identity<const_ccs::Property_*>,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
    ::~_Rb_tree(&local_90.second.values._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
      operator_delete(local_90.first._M_dataplus._M_p,
                      local_90.first.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0014bac0;
  }
  p_Var1 = iVar5._M_node + 2;
  cVar3 = *(char *)&iVar5._M_node[2]._M_parent;
  if (local_d0.override == true) {
    if (cVar3 != '\0') goto LAB_0014ba96;
  }
  else {
    if (cVar3 != '\0') goto LAB_0014bac0;
LAB_0014ba96:
    uVar4 = *(uint *)&iVar5._M_node[2].field_0x4;
    if ((local_d0.spec.values <= uVar4) &&
       ((uVar4 != local_d0.spec.values || (local_d0.spec.names <= p_Var1->_M_color)))) {
      if (cVar3 == '\0') {
        if (local_d0.override == false) {
          if (local_d0.spec.values < uVar4) goto LAB_0014bac0;
          goto LAB_0014baff;
        }
      }
      else {
        if ((uVar4 <= local_d0.spec.values & local_d0.override) == 0) goto LAB_0014bac0;
LAB_0014baff:
        if (local_d0.spec.names < p_Var1->_M_color) goto LAB_0014bac0;
      }
      std::
      _Rb_tree<ccs::Property_const*,ccs::Property_const*,std::_Identity<ccs::Property_const*>,std::less<ccs::Property_const*>,std::allocator<ccs::Property_const*>>
      ::_M_insert_unique<ccs::Property_const*const&>
                ((_Rb_tree<ccs::Property_const*,ccs::Property_const*,std::_Identity<ccs::Property_const*>,std::less<ccs::Property_const*>,std::allocator<ccs::Property_const*>>
                  *)&iVar5._M_node[2]._M_left,&local_d8);
      goto LAB_0014bac0;
    }
  }
  *(bool *)&iVar5._M_node[2]._M_parent = local_d0.override;
  *(ulong *)p_Var1 = CONCAT44(local_d0.spec.values,local_d0.spec.names);
  std::
  _Rb_tree<const_ccs::Property_*,_const_ccs::Property_*,_std::_Identity<const_ccs::Property_*>,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
  ::operator=((_Rb_tree<const_ccs::Property_*,_const_ccs::Property_*,_std::_Identity<const_ccs::Property_*>,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
               *)&iVar5._M_node[2]._M_left,&local_d0.values._M_t);
LAB_0014bac0:
  std::
  _Rb_tree<const_ccs::Property_*,_const_ccs::Property_*,_std::_Identity<const_ccs::Property_*>,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
  ::~_Rb_tree(&local_d0.values._M_t);
  return;
}

Assistant:

void cacheProperty(const std::string &propertyName,
      Specificity spec, const Property *property) {
    auto it = properties.find(propertyName);

    PropertySetting newSetting(spec, property);

    if (it == properties.end()) {
      // we don't have a local setting for this yet.
      auto parentProperty = parent ? parent->checkCache(propertyName) : nullptr;
      if (parentProperty) {
        if (parentProperty->better(newSetting))
          // parent copy found, parent property better, leave local cache empty.
          return;

        // copy parent property into local cache. this is done solely to
        // support conflict detection.
        it = properties.insert(std::make_pair(propertyName, *parentProperty))
            .first;
      }
    }

    if (it == properties.end()) {
      properties.insert(std::make_pair(propertyName, newSetting));
    } else if (newSetting.better(it->second)) {
      // new property better than local cache. replace.
      it->second = newSetting;
    } else if (it->second.better(newSetting)) {
      // ignore
    } else {
      // new property has same specificity/override as existing... append.
      it->second.values.insert(property);
    }
  }